

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MatchTestTest.cpp
# Opt level: O2

void __thiscall MatchTestTest::MatchTestTest(MatchTestTest *this)

{
  allocator<char> local_109;
  shared_ptr<oout::StringText> local_108;
  shared_ptr<oout::StringText> local_f8;
  char local_e8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e0;
  shared_ptr<oout::StringText> local_d8;
  shared_ptr<const_oout::NamedTest> local_c8;
  char local_b8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b0;
  shared_ptr<oout::ContainMatch> local_a8;
  shared_ptr<oout::ContainMatch> local_98;
  unique_ptr<TestText,_std::default_delete<TestText>_> local_88;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_80;
  shared_ptr<const_oout::NamedTest> local_78;
  char local_68 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  shared_ptr<oout::EqualMatch> local_58;
  unique_ptr<TestText,_std::default_delete<TestText>_> local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  shared_ptr<const_oout::NamedTest> local_38;
  string local_28;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"MatchTest test",&local_109);
  std::make_shared<oout::StringText,char_const(&)[5]>((char (*) [5])&local_58);
  std::make_shared<oout::EqualMatch,char_const(&)[5]>((char (*) [5])local_68);
  std::
  make_unique<oout::MatchTest,std::shared_ptr<oout::StringText>,std::shared_ptr<oout::EqualMatch>>
            (&local_f8,&local_58);
  std::make_unique<TestText,std::unique_ptr<oout::MatchTest,std::default_delete<oout::MatchTest>>>
            ((unique_ptr<oout::MatchTest,_std::default_delete<oout::MatchTest>_> *)
             &local_f8.super___shared_ptr<oout::StringText,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::
  make_shared<oout::EqualTest,std::unique_ptr<TestText,std::default_delete<TestText>>,char_const(&)[8]>
            (&local_48,
             (char (*) [8])
             &local_f8.super___shared_ptr<oout::StringText,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::make_shared<oout::NamedTest_const,char_const(&)[45],std::shared_ptr<oout::EqualTest>>
            ((char (*) [45])&local_38,
             (shared_ptr<oout::EqualTest> *)"MatchTest success with success equal matcher");
  std::make_shared<oout::StringText,char_const(&)[5]>((char (*) [5])&local_98);
  std::make_shared<oout::ContainMatch,char_const(&)[3]>((char (*) [3])&local_a8);
  std::make_shared<oout::ContainMatch,char_const(&)[3]>((char (*) [3])local_b8);
  std::
  make_unique<oout::MatchTest,std::shared_ptr<oout::StringText>,std::shared_ptr<oout::ContainMatch>,std::shared_ptr<oout::ContainMatch>>
            (&local_108,&local_98,&local_a8);
  std::make_unique<TestText,std::unique_ptr<oout::MatchTest,std::default_delete<oout::MatchTest>>>
            ((unique_ptr<oout::MatchTest,_std::default_delete<oout::MatchTest>_> *)
             &local_108.super___shared_ptr<oout::StringText,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  std::
  make_shared<oout::EqualTest,std::unique_ptr<TestText,std::default_delete<TestText>>,char_const(&)[8]>
            (&local_88,
             (char (*) [8])
             &local_108.super___shared_ptr<oout::StringText,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  std::make_shared<oout::NamedTest_const,char_const(&)[43],std::shared_ptr<oout::EqualTest>>
            ((char (*) [43])&local_78,
             (shared_ptr<oout::EqualTest> *)"MatchTest success with all success matcher");
  std::make_shared<oout::StringText,char_const(&)[5]>((char (*) [5])local_e8);
  std::make_shared<oout::MatchTest,std::shared_ptr<oout::StringText>,char_const(&)[5]>
            (&local_d8,(char (*) [5])local_e8);
  std::make_shared<oout::NamedTest_const,char_const(&)[33],std::shared_ptr<oout::MatchTest>>
            ((char (*) [33])&local_c8,
             (shared_ptr<oout::MatchTest> *)"MatchTest check equal by default");
  oout::dirty::Test::
  Test<std::shared_ptr<oout::NamedTest_const>,std::shared_ptr<oout::NamedTest_const>,std::shared_ptr<oout::NamedTest_const>>
            (&this->super_Test,&local_28,&local_38,&local_78,&local_c8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_c8.super___shared_ptr<const_oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_d8.super___shared_ptr<oout::StringText,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_78.super___shared_ptr<const_oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80);
  std::unique_ptr<TestText,_std::default_delete<TestText>_>::~unique_ptr
            ((unique_ptr<TestText,_std::default_delete<TestText>_> *)
             &local_108.super___shared_ptr<oout::StringText,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  std::unique_ptr<oout::MatchTest,_std::default_delete<oout::MatchTest>_>::~unique_ptr
            ((unique_ptr<oout::MatchTest,_std::default_delete<oout::MatchTest>_> *)&local_108);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_a8.super___shared_ptr<oout::ContainMatch,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_98.super___shared_ptr<oout::ContainMatch,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_38.super___shared_ptr<const_oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40);
  std::unique_ptr<TestText,_std::default_delete<TestText>_>::~unique_ptr
            ((unique_ptr<TestText,_std::default_delete<TestText>_> *)
             &local_f8.super___shared_ptr<oout::StringText,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::unique_ptr<oout::MatchTest,_std::default_delete<oout::MatchTest>_>::~unique_ptr
            ((unique_ptr<oout::MatchTest,_std::default_delete<oout::MatchTest>_> *)&local_f8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_58.super___shared_ptr<oout::EqualMatch,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__cxx11::string::~string((string *)&local_28);
  (this->super_Test).super_Test._vptr_Test = (_func_int **)&PTR__Test_001cc398;
  return;
}

Assistant:

MatchTestTest::MatchTestTest()
: dirty::Test(
	"MatchTest test",
	make_shared<const NamedTest>(
		"MatchTest success with success equal matcher",
		make_shared<EqualTest>(
			make_unique<TestText>(
				make_unique<MatchTest>(
					make_shared<StringText>("test"),
					make_shared<EqualMatch>("test")
				)
			),
			"success"
		)
	),
	make_shared<const NamedTest>(
		"MatchTest success with all success matcher",
		make_shared<EqualTest>(
			make_unique<TestText>(
				make_unique<MatchTest>(
					make_shared<StringText>("test"),
					make_shared<ContainMatch>("te"),
					make_shared<ContainMatch>("st")
				)
			),
			"success"
		)
	),
	make_shared<const NamedTest>(
		"MatchTest check equal by default",
		make_shared<MatchTest>(
			make_shared<StringText>("test"),
			"test"
		)
	)
)
{
}